

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

error_code wave::make_error_code(Error err)

{
  error_code eVar1;
  undefined1 local_18 [4];
  Error err_local;
  error_category *local_10;
  
  switch(err) {
  case kFailedToOpen:
    eVar1 = std::make_error_code(io_error);
    local_10 = eVar1._M_cat;
    local_18 = (undefined1  [4])eVar1._M_value;
    break;
  case kNotOpen:
    eVar1 = std::make_error_code(operation_not_permitted);
    local_10 = eVar1._M_cat;
    local_18 = (undefined1  [4])eVar1._M_value;
    break;
  case kInvalidFormat:
    eVar1 = std::make_error_code(executable_format_error);
    local_10 = eVar1._M_cat;
    local_18 = (undefined1  [4])eVar1._M_value;
    break;
  case kWriteError:
    eVar1 = std::make_error_code(io_error);
    local_10 = eVar1._M_cat;
    local_18 = (undefined1  [4])eVar1._M_value;
    break;
  case kReadError:
    eVar1 = std::make_error_code(io_error);
    local_10 = eVar1._M_cat;
    local_18 = (undefined1  [4])eVar1._M_value;
    break;
  default:
    std::error_code::error_code((error_code *)local_18);
  }
  eVar1._4_4_ = 0;
  eVar1._M_value = (int)local_18;
  eVar1._M_cat = local_10;
  return eVar1;
}

Assistant:

std::error_code make_error_code(Error err) {
  switch (err) {
    case kFailedToOpen:
      return std::make_error_code(std::errc::io_error);
    case kNotOpen:
      return std::make_error_code(std::errc::operation_not_permitted);
    case kInvalidFormat:
      return std::make_error_code(std::errc::executable_format_error);
    case kWriteError:
      return std::make_error_code(std::errc::io_error);
    case kReadError:
      return std::make_error_code(std::errc::io_error);
    default:
      return std::error_code();
  }
}